

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O3

size_t absl::lts_20240722::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  Duration DVar1;
  int extraout_EAX;
  uint uVar2;
  long lVar3;
  undefined1 *puVar4;
  ulong uVar5;
  undefined2 *puVar6;
  undefined4 in_register_0000000c;
  Nonnull<char_*> pcVar7;
  ulong uVar8;
  char *args;
  int extraout_EDX;
  int extraout_EDX_00;
  LogSeverity unaff_EBP;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  HiRep n;
  char *pcVar12;
  ulong unaff_R15;
  Time TVar13;
  Time TVar14;
  UntypedFormatSpecImpl UVar15;
  CivilInfo ci;
  Nonnull<char_*> local_80;
  int local_6c;
  int local_68;
  int local_64;
  FormatSpec<char,_int,_int,_int> local_60;
  HiRep local_50;
  uint32_t local_48;
  
  pcVar7 = (Nonnull<char_*>)CONCAT44(in_register_0000000c,tid);
  pcVar10 = basename._M_str;
  uVar11 = basename._M_len;
  n = timestamp.rep_.rep_hi_;
  if (buf->len_ < 0x22) {
    buf->len_ = 0;
    goto LAB_0010274f;
  }
  unaff_R15 = (ulong)timestamp.rep_.rep_lo_;
  lVar3 = absl::lts_20240722::log_internal::TimeZone();
  pcVar12 = pcVar10;
  local_80 = pcVar7;
  if (lVar3 == 0) goto LAB_001026b8;
  pcVar12 = buf->ptr_;
  if (severity < 4) {
    pcVar9 = (&PTR_anon_var_dwarf_88_00104ca8)[severity];
  }
  else {
    pcVar9 = "UNKNOWN";
  }
  *pcVar12 = *pcVar9;
  TVar13.rep_.rep_lo_ = (uint32_t)lVar3;
  TVar13.rep_.rep_hi_ = (HiRep)&local_60;
  absl::lts_20240722::TimeZone::At(TVar13);
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)(char)local_60.super_type.spec_.size_,pcVar12 + 1);
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)local_60.super_type.spec_.size_._1_1_,pcVar12 + 3);
  pcVar12[5] = ' ';
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)local_60.super_type.spec_.size_._2_1_,pcVar12 + 6);
  pcVar12[8] = ':';
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)local_60.super_type.spec_.size_._3_1_,pcVar12 + 9);
  pcVar12[0xb] = ':';
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)local_60.super_type.spec_.size_._4_1_,pcVar12 + 0xc);
  pcVar12[0xe] = '.';
  DVar1.rep_lo_ = local_48;
  DVar1.rep_hi_ = local_50;
  lVar3 = absl::lts_20240722::ToInt64Microseconds(DVar1);
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)(SUB168(SEXT816(lVar3) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
             (SUB164(SEXT816(lVar3) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f),pcVar12 + 0xf);
  unaff_R15 = lVar3 / 100;
  absl::lts_20240722::numbers_internal::PutTwoDigits
            ((int)unaff_R15 +
             ((int)(SUB168(SEXT816((long)unaff_R15) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
             (SUB164(SEXT816((long)unaff_R15) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) * -100,
             pcVar12 + 0x11);
  severity = (int)lVar3 + (int)unaff_R15 * -100;
  absl::lts_20240722::numbers_internal::PutTwoDigits(severity,pcVar12 + 0x13);
  pcVar12[0x15] = ' ';
  if ((uint)tid < 10) {
    pcVar12[0x16] = ' ';
    pcVar12 = pcVar12 + 0x17;
LAB_00102522:
    *pcVar12 = ' ';
    pcVar12 = pcVar12 + 1;
LAB_00102532:
    *pcVar12 = ' ';
    pcVar12 = pcVar12 + 1;
LAB_0010253a:
    *pcVar12 = ' ';
    pcVar12 = pcVar12 + 1;
LAB_00102542:
    *pcVar12 = ' ';
    pcVar12 = pcVar12 + 1;
  }
  else {
    pcVar12 = pcVar12 + 0x16;
    if (tid + 9U < 0x6d) goto LAB_00102522;
    if (tid + 99U < 1099) goto LAB_00102532;
    if (tid + 999U < 10999) goto LAB_0010253a;
    if (tid + 9999U < 109999) goto LAB_00102542;
    if (0x10c8de < tid + 99999U) goto LAB_00102552;
  }
  *pcVar12 = ' ';
  pcVar12 = pcVar12 + 1;
LAB_00102552:
  pcVar9 = pcVar12;
  puVar4 = (undefined1 *)absl::lts_20240722::numbers_internal::FastIntToBuffer(tid,pcVar12);
  *puVar4 = 0x20;
  n = (HiRep)((long)puVar4 + (1 - (long)buf->ptr_));
  if (buf->len_ < (ulong)n) {
    FormatLogPrefix();
    goto LAB_00102701;
  }
  buf->ptr_ = buf->ptr_ + (long)n;
  buf->len_ = buf->len_ - (long)n;
  do {
    if (buf->len_ < uVar11) {
      uVar11 = buf->len_;
    }
    memcpy(buf->ptr_,pcVar10,uVar11);
    uVar5 = buf->len_ - uVar11;
    pcVar12 = pcVar10;
    if (buf->len_ < uVar11) {
      FormatLogPrefix();
LAB_001026b8:
      TVar14.rep_.rep_lo_ = (uint32_t)unaff_R15;
      TVar14.rep_.rep_hi_ = n;
      local_64 = absl::lts_20240722::ToTimeval(TVar14);
      pcVar7 = buf->ptr_;
      pcVar9 = (char *)buf->len_;
      local_60.super_type.spec_.data_ = "%c0000 00:00:%02d.%06d %7d ";
      local_60.super_type.spec_.size_ = 0x1b;
      local_68 = extraout_EDX;
      if (kFatal < severity) goto LAB_00102706;
      args = (&PTR_anon_var_dwarf_88_00104ca8)[severity];
      pcVar10 = pcVar12;
    }
    else {
      pcVar9 = buf->ptr_ + uVar11;
      buf->ptr_ = pcVar9;
      buf->len_ = uVar5;
      if (uVar5 < 0xe) {
        uVar8 = 0;
        uVar5 = 0;
        goto LAB_001025f6;
      }
      pcVar7 = (Nonnull<char_*>)(ulong)(uint)line;
      *pcVar9 = ':';
      puVar6 = (undefined2 *)absl::lts_20240722::numbers_internal::FastIntToBuffer(line,pcVar9 + 1);
      *puVar6 = 0x205d;
      pcVar9 = buf->ptr_;
      uVar5 = (long)puVar6 + (2 - (long)pcVar9);
      uVar8 = buf->len_ - uVar5;
      if (uVar5 <= buf->len_) {
        pcVar9 = pcVar9 + uVar5;
        buf->ptr_ = pcVar9;
LAB_001025f6:
        puVar4 = (undefined1 *)(uVar11 + (long)n) + uVar5;
        buf->len_ = uVar8;
        if (format == kRaw) {
          uVar11 = 5;
          if (uVar8 < 5) {
            uVar11 = uVar8;
          }
          pcVar10 = "RAW: ";
          memcpy(pcVar9,"RAW: ",uVar11);
          if (buf->len_ < uVar11) {
            FormatLogPrefix();
            UVar15.size_ = *(size_t *)pcVar10;
            UVar15.data_ = pcVar9;
            absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                      (UVar15,*(Span **)((long)pcVar10 + 8));
            return (size_t)pcVar9;
          }
          buf->ptr_ = buf->ptr_ + uVar11;
          buf->len_ = buf->len_ - uVar11;
          puVar4 = puVar4 + uVar11;
        }
        return (size_t)puVar4;
      }
LAB_00102701:
      FormatLogPrefix();
      local_64 = extraout_EAX;
      local_68 = extraout_EDX_00;
LAB_00102706:
      args = "UNKNOWN";
      pcVar10 = pcVar12;
    }
    local_6c = (int)local_80;
    uVar2 = SNPrintF<char,_int,_int,_int>
                      (pcVar7,(size_t)pcVar9,&local_60,args,&local_64,&local_68,&local_6c);
    unaff_EBP = severity;
    if ((int)uVar2 < 0) {
LAB_0010274f:
      n.lo_ = 0;
      n.hi_ = 0;
      severity = unaff_EBP;
    }
    else {
      n.hi_ = 0;
      n.lo_ = uVar2;
      Span<char>::remove_prefix(buf,(size_type)n);
    }
  } while( true );
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}